

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadComponentIndex(ON_BinaryArchive *this,ON_COMPONENT_INDEX *ci)

{
  bool bVar1;
  TYPE TVar2;
  undefined8 in_RAX;
  int t;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  ci->m_type = invalid_type;
  ci->m_index = 0;
  bVar1 = ReadInt(this,&local_14);
  if ((bVar1) && (bVar1 = ReadInt(this,&ci->m_index), bVar1)) {
    TVar2 = ON_COMPONENT_INDEX::Type(local_14);
    ci->m_type = TVar2;
    return true;
  }
  return false;
}

Assistant:

bool
ON_BinaryArchive::ReadComponentIndex(
		ON_COMPONENT_INDEX& ci
		)
{
  int t;
  ci.m_type = ON_COMPONENT_INDEX::invalid_type;
  ci.m_index = 0;
  bool rc = ReadInt( &t );
  if (rc)
  {
    rc = ReadInt( &ci.m_index );
    if (rc)
    {
      ci.m_type = ON_COMPONENT_INDEX::Type(t);
    }
    // do not add additional read - you will break old file IO
  }
  return rc;
}